

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O2

token * bitwise_or_expression(dmr_C *C,token *token,expression **tree)

{
  token *ptVar1;
  expression *peVar2;
  char *pcVar3;
  expression *peVar4;
  expression *local_48;
  expression *local_40;
  expression *right;
  
  local_48 = (expression *)0x0;
  ptVar1 = bitwise_xor_expression(C,token,&local_48);
  if (local_48 == (expression *)0x0) {
    peVar4 = (expression *)0x0;
  }
  else {
    peVar4 = local_48;
    right = (expression *)tree;
    while( true ) {
      tree = (expression **)right;
      if (((SUB84(ptVar1->pos,0) & 0x3f) != 0x11) ||
         (local_40 = (expression *)0x0, (ptVar1->field_2).special != 0x7c)) goto LAB_00108ad6;
      peVar2 = dmrC_alloc_expression(C,ptVar1->pos,5);
      ptVar1 = bitwise_xor_expression(C,ptVar1->next,&local_40);
      if (local_40 == (expression *)0x0) break;
      peVar2->field_0x1 =
           (byte)((ushort)*(undefined2 *)peVar4 >> 8) & (byte)((ushort)*(undefined2 *)local_40 >> 8)
           & 1;
      peVar2->op = 0x7c;
      (peVar2->field_5).field_3.unop = peVar4;
      (peVar2->field_5).field_2.string = (string *)local_40;
      peVar4 = peVar2;
    }
    pcVar3 = dmrC_show_special(C,0x7c);
    dmrC_sparse_error(C,ptVar1->pos,"No right hand side of \'%s\'-expression",pcVar3);
    tree = (expression **)right;
  }
LAB_00108ad6:
  *tree = peVar4;
  return ptVar1;
}

Assistant:

static struct token *bitwise_or_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C,
		token, tree, EXPR_BINOP, bitwise_xor_expression,
		(op == '|')
	);
}